

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O3

void slang::ast::ParameterSymbolBase::fromLocalSyntax
               (Scope *scope,ParameterDeclarationStatementSyntax *syntax,
               SmallVectorBase<slang::ast::Symbol_*> *results)

{
  TypeParameterDeclarationSyntax *syntax_00;
  Symbol *pSVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  pointer ppPVar2;
  long lVar3;
  long lVar4;
  SmallVector<slang::ast::ParameterSymbol_*,_5UL> params;
  Symbol *local_80;
  SmallVectorBase<slang::ast::Symbol_*> *local_78;
  SmallVectorBase<slang::ast::ParameterSymbol_*> local_70 [2];
  
  syntax_00 = (TypeParameterDeclarationSyntax *)(syntax->parameter).ptr;
  local_78 = results;
  if ((syntax_00->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind ==
      ParameterDeclaration) {
    local_70[0].data_ = (pointer)local_70[0].firstElement;
    local_70[0].len = 0;
    local_70[0].cap = 5;
    ParameterSymbol::fromSyntax(scope,(ParameterDeclarationSyntax *)syntax_00,true,false,local_70);
    ppPVar2 = local_70[0].data_;
    if (local_70[0].len != 0) {
      lVar4 = local_70[0].len << 3;
      lVar3 = 0;
      do {
        pSVar1 = *(Symbol **)((long)ppPVar2 + lVar3);
        syntax_01._M_ptr =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
        syntax_01._M_extent._M_extent_value =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
        Symbol::setAttributes(pSVar1,scope,syntax_01);
        local_80 = pSVar1;
        SmallVectorBase<slang::ast::Symbol*>::emplace_back<slang::ast::Symbol*>
                  ((SmallVectorBase<slang::ast::Symbol*> *)local_78,&local_80);
        lVar3 = lVar3 + 8;
      } while (lVar4 != lVar3);
    }
  }
  else {
    local_70[0].data_ = (pointer)local_70[0].firstElement;
    local_70[0].len = 0;
    local_70[0].cap = 5;
    TypeParameterSymbol::fromSyntax
              (scope,syntax_00,true,false,
               (SmallVectorBase<slang::ast::TypeParameterSymbol_*> *)local_70);
    ppPVar2 = local_70[0].data_;
    if (local_70[0].len != 0) {
      lVar4 = local_70[0].len << 3;
      lVar3 = 0;
      do {
        pSVar1 = *(Symbol **)((long)ppPVar2 + lVar3);
        syntax_02._M_ptr =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
        syntax_02._M_extent._M_extent_value =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
        Symbol::setAttributes(pSVar1,scope,syntax_02);
        local_80 = pSVar1;
        SmallVectorBase<slang::ast::Symbol*>::emplace_back<slang::ast::Symbol*>
                  ((SmallVectorBase<slang::ast::Symbol*> *)local_78,&local_80);
        lVar3 = lVar3 + 8;
      } while (lVar4 != lVar3);
    }
  }
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return;
}

Assistant:

void ParameterSymbolBase::fromLocalSyntax(const Scope& scope,
                                          const ParameterDeclarationStatementSyntax& syntax,
                                          SmallVectorBase<Symbol*>& results) {
    auto paramBase = syntax.parameter;
    if (paramBase->kind == SyntaxKind::ParameterDeclaration) {
        SmallVector<ParameterSymbol*> params;
        ParameterSymbol::fromSyntax(scope, paramBase->as<ParameterDeclarationSyntax>(),
                                    /* isLocal */ true, /* isPort */ false, params);
        for (auto param : params) {
            param->setAttributes(scope, syntax.attributes);
            results.push_back(param);
        }
    }
    else {
        SmallVector<TypeParameterSymbol*> params;
        TypeParameterSymbol::fromSyntax(scope, paramBase->as<TypeParameterDeclarationSyntax>(),
                                        /* isLocal */ true, /* isPort */ false, params);
        for (auto param : params) {
            param->setAttributes(scope, syntax.attributes);
            results.push_back(param);
        }
    }
}